

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O3

fdb_status wal_release_flushed_items(filemgr *file,wal_flush_items *flush_items)

{
  pthread_spinlock_t *__lock;
  wal *pwVar1;
  list_elem *e;
  uint32_t uVar2;
  snap_handle *shandle;
  avl_node *paVar3;
  ulong uVar4;
  
  pwVar1 = file->wal;
  __lock = &pwVar1->lock;
  pthread_spin_lock(__lock);
  for (paVar3 = avl_first(&pwVar1->wal_snapshot_tree); paVar3 != (avl_node *)0x0;
      paVar3 = avl_next(paVar3)) {
    *(undefined1 *)((long)&paVar3[2].parent + 2) = 1;
  }
  pthread_spin_unlock(__lock);
  if ((flush_items->tree).aux == (void *)0x1) {
    paVar3 = avl_first(&flush_items->tree);
    while (paVar3 != (avl_node *)0x0) {
      avl_remove(&flush_items->tree,paVar3);
      uVar2 = get_checksum((uint8_t *)paVar3[-3].left[1].parent,
                           (ulong)*(ushort *)&paVar3[-3].left[1].left,0,CRC32);
      uVar4 = (ulong)uVar2 % file->wal->num_shards;
      pthread_spin_lock(&file->wal->key_shards[uVar4].lock);
      _wal_release_items(file,uVar4,(wal_item *)&paVar3[-5].right);
      pthread_spin_unlock(&file->wal->key_shards[uVar4].lock);
      paVar3 = avl_first(&flush_items->tree);
    }
  }
  else {
    while (e = (flush_items->list).head, e != (list_elem *)0x0) {
      list_remove(&flush_items->list,e);
      uVar2 = get_checksum((uint8_t *)e[-4].prev[1].next,(ulong)*(ushort *)&e[-4].prev[2].prev,0,
                           CRC32);
      uVar4 = (ulong)uVar2 % file->wal->num_shards;
      pthread_spin_lock(&file->wal->key_shards[uVar4].lock);
      _wal_release_items(file,uVar4,(wal_item *)&e[-7].next);
      pthread_spin_unlock(&file->wal->key_shards[uVar4].lock);
    }
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_release_flushed_items(struct filemgr *file,
                                     union wal_flush_items *flush_items)
{
    struct wal_item *item;
    size_t shard_num;

    _wal_snap_mark_flushed(file->wal); // Read-write barrier: items are in trie

    if (_wal_are_items_sorted(flush_items)) {
        struct avl_tree *tree = &flush_items->tree;
        // scan and remove entries in the avl-tree
        while (1) {
            struct avl_node *a;
            if ((a = avl_first(tree)) == NULL) {
                break;
            }
            item = _get_entry(a, struct wal_item, avl_flush);
            avl_remove(tree, &item->avl_flush);

            // Grab the WAL key shard lock.
            shard_num = get_checksum((uint8_t*)item->header->key,
                                     item->header->keylen)
                                     % file->wal->num_shards;
            spin_lock(&file->wal->key_shards[shard_num].lock);

            _wal_release_items(file, shard_num, item);

            spin_unlock(&file->wal->key_shards[shard_num].lock);
        }
    } else {
        struct list *list_head = &flush_items->list;
        // scan and remove entries in the avl-tree
        while (1) {
            struct list_elem *a;
            if ((a = list_begin(list_head)) == NULL) {
                break;
            }
            item = _get_entry(a, struct wal_item, list_elem_flush);
            list_remove(list_head, &item->list_elem_flush);

            // Grab the WAL key shard lock.
            shard_num = get_checksum((uint8_t*)item->header->key,
                                     item->header->keylen)
                                     % file->wal->num_shards;
            spin_lock(&file->wal->key_shards[shard_num].lock);
            _wal_release_items(file, shard_num, item);
            spin_unlock(&file->wal->key_shards[shard_num].lock);
        }
    }

    return FDB_RESULT_SUCCESS;
}